

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O1

void __thiscall
QMimeAllGlobPatterns::matchingGlobs
          (QMimeAllGlobPatterns *this,QString *fileName,QMimeGlobMatchResult *result,
          AddMatchFilterFunc *filterFunc)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  QString *mimeType;
  long lVar4;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1String,_const_QString_&> local_b0;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QMimeGlobPatternList::match(&this->m_highWeightGlobs,result,fileName,filterFunc);
  uVar2 = QString::lastIndexOf(fileName,(QChar)0x2e,-1,CaseSensitive);
  if (uVar2 != 0xffffffffffffffff) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::right((QString *)&local_78,fileName,~uVar2 + (fileName->d).size);
    QString::toLower_helper(&local_58,(QString *)&local_78);
    if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
      }
    }
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QHash<QString,_QList<QString>_>::value
              ((QList<QString> *)&local_78,&this->m_fastPatterns,&local_58);
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_b0.a.m_size = 2;
    local_b0.a.m_data = "*.";
    local_b0.b = &local_58;
    QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>(&local_98,&local_b0);
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      lVar4 = local_78.size * 0x18;
      mimeType = local_78.ptr;
      do {
        if ((filterFunc->super__Function_base)._M_manager == (_Manager_type)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar3 = std::__throw_bad_function_call();
            QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar3);
            }
          }
          goto LAB_004b5626;
        }
        bVar1 = (*filterFunc->_M_invoker)((_Any_data *)filterFunc,mimeType);
        if (bVar1) {
          QMimeGlobMatchResult::addMatch(result,mimeType,0x32,&local_98,local_58.d.size);
        }
        mimeType = mimeType + 1;
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QMimeGlobPatternList::match(&this->m_lowWeightGlobs,result,fileName,filterFunc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004b5626:
  __stack_chk_fail();
}

Assistant:

void QMimeAllGlobPatterns::matchingGlobs(const QString &fileName, QMimeGlobMatchResult &result,
                                         const AddMatchFilterFunc &filterFunc) const
{
    // First try the high weight matches (>50), if any.
    m_highWeightGlobs.match(result, fileName, filterFunc);

    // Now use the "fast patterns" dict, for simple *.foo patterns with weight 50
    // (which is most of them, so this optimization is definitely worth it)
    const qsizetype lastDot = fileName.lastIndexOf(u'.');
    if (lastDot != -1) { // if no '.', skip the extension lookup
        const qsizetype ext_len = fileName.size() - lastDot - 1;
        const QString simpleExtension = fileName.right(ext_len).toLower();
        // (toLower because fast patterns are always case-insensitive and saved as lowercase)

        const QStringList matchingMimeTypes = m_fastPatterns.value(simpleExtension);
        const QString simplePattern = "*."_L1 + simpleExtension;
        for (const QString &mime : matchingMimeTypes) {
            if (filterFunc(mime)) {
                result.addMatch(mime, 50, simplePattern, simpleExtension.size());
            }
        }
        // Can't return yet; *.tar.bz2 has to win over *.bz2, so we need the low-weight mimetypes anyway,
        // at least those with weight 50.
    }

    // Finally, try the low weight matches (<=50)
    m_lowWeightGlobs.match(result, fileName, filterFunc);
}